

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_add_tet_without_faceid(REF_CAVITY ref_cavity,REF_INT tet,REF_INT faceid)

{
  int iVar1;
  REF_GRID pRVar2;
  REF_CELL pRVar3;
  REF_NODE pRVar4;
  REF_CELL pRVar5;
  REF_INT *pRVar6;
  REF_INT *pRVar7;
  REF_MPI pRVar8;
  REF_INT *pRVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  REF_INT already_have_it;
  REF_INT tri_index;
  REF_INT face_nodes [3];
  int local_60;
  int local_5c;
  REF_CELL local_58;
  REF_NODE local_50;
  long local_48;
  REF_INT local_3c [3];
  
  if (-1 < tet) {
    pRVar2 = ref_cavity->ref_grid;
    pRVar3 = pRVar2->cell[8];
    if ((tet < pRVar3->max) && (pRVar3->c2n[(long)pRVar3->size_per * (long)tet] != -1)) {
      pRVar4 = pRVar2->node;
      pRVar5 = pRVar2->cell[3];
      uVar10 = ref_list_contains(ref_cavity->tet_list,tet,&local_60);
      if (uVar10 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x255,"ref_cavity_add_tet_without_faceid",(ulong)uVar10,"have tet?");
        return uVar10;
      }
      if (local_60 != 0) {
        return 0;
      }
      local_58 = pRVar5;
      local_50 = pRVar4;
      local_48 = (long)tet;
      uVar10 = ref_list_push(ref_cavity->tet_list,tet);
      if (uVar10 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               600,"ref_cavity_add_tet_without_faceid",(ulong)uVar10,"save tet");
        return uVar10;
      }
      if (0 < pRVar3->face_per) {
        lVar13 = 0;
        lVar14 = 0;
        uVar10 = 0;
        do {
          pRVar6 = pRVar3->c2n;
          pRVar7 = local_50->part;
          pRVar8 = local_50->ref_mpi;
          pRVar9 = pRVar3->f2n;
          lVar12 = 0;
          do {
            iVar1 = pRVar6[pRVar3->size_per * local_48 +
                           (long)*(int *)((long)pRVar9 + lVar12 * 4 + lVar13)];
            local_3c[lVar12] = iVar1;
            if (pRVar8->id != pRVar7[iVar1]) {
              ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
              return 0;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          uVar11 = ref_cell_with(local_58,local_3c,&local_5c);
          if ((uVar11 != 0) && (uVar11 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x264,"ref_cavity_add_tet_without_faceid",(ulong)uVar11,
                   "search for boundary tri");
            uVar10 = uVar11;
          }
          if ((uVar11 != 5) && (uVar11 != 0)) {
            return uVar10;
          }
          if (((long)local_5c == -1) ||
             (local_58->c2n[(long)local_58->size_per * (long)local_5c + 3] != faceid)) {
            uVar11 = ref_cavity_insert_face(ref_cavity,local_3c);
            if (uVar11 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x26a,"ref_cavity_add_tet_without_faceid",(ulong)uVar11,"tet side");
              return uVar11;
            }
            if (ref_cavity->state != REF_CAVITY_UNKNOWN) {
              return 0;
            }
          }
          lVar14 = lVar14 + 1;
          lVar13 = lVar13 + 0x10;
          if (pRVar3->face_per <= lVar14) {
            return 0;
          }
        } while( true );
      }
      return 0;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x252,
         "ref_cavity_add_tet_without_faceid","invalid tet");
  return 1;
}

Assistant:

static REF_FCN REF_STATUS ref_cavity_add_tet_without_faceid(
    REF_CAVITY ref_cavity, REF_INT tet, REF_INT faceid) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_CELL tet_cell = ref_grid_tet(ref_grid);
  REF_CELL tri_cell = ref_grid_tri(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT cell_face, node, tri_index;
  REF_INT face_nodes[3];
  REF_INT already_have_it;

  RAS(ref_cell_valid(tet_cell, tet), "invalid tet");

  RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), tet, &already_have_it),
      "have tet?");
  if (already_have_it) return REF_SUCCESS;

  RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), tet), "save tet");

  each_ref_cell_cell_face(tet_cell, cell_face) {
    each_ref_cavity_face_node(ref_cavity, node) {
      face_nodes[node] = ref_cell_f2n(tet_cell, node, cell_face, tet);
      if (!ref_node_owned(ref_node, face_nodes[node])) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }

    RXS(ref_cell_with(tri_cell, face_nodes, &tri_index), REF_NOT_FOUND,
        "search for boundary tri");
    if (REF_EMPTY != tri_index &&
        ref_cell_c2n(tri_cell, 3, tri_index) == faceid) {
      continue;
    }

    RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
    if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_SUCCESS;
  }

  return REF_SUCCESS;
}